

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void init_adf_data(warm_cb *data,size_t num_actions)

{
  reference ppeVar1;
  label *plVar2;
  label *plVar3;
  ulong in_RSI;
  long in_RDI;
  uint32_t i;
  uint32_t a_1;
  label *lab;
  size_t a;
  size_t in_stack_00000188;
  example *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar4;
  warm_cb *in_stack_ffffffffffffffe0;
  size_type local_18;
  
  *(int *)(in_RDI + 0xa8) = (int)in_RSI;
  if ((*(byte *)(in_RDI + 0xa4) & 1) == 0) {
    *(undefined4 *)(in_RDI + 0xa0) = 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0xa0) = 2;
  }
  std::vector<example_*,_std::allocator<example_*>_>::resize
            ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffe0,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffb8 =
         VW::alloc_examples(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_18);
    *ppeVar1 = in_stack_ffffffffffffffb8;
    ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        ((vector<example_*,_std::allocator<example_*>_> *)(in_RDI + 0x58),local_18);
    in_stack_ffffffffffffffe0 = (warm_cb *)&(*ppeVar1)->l;
    (*(code *)CB::cb_label)(in_stack_ffffffffffffffe0);
  }
  plVar2 = calloc_or_throw<COST_SENSITIVE::label>(in_stack_00000188);
  *(label **)(in_RDI + 0x168) = plVar2;
  for (uVar4 = 0; uVar4 < in_RSI; uVar4 = uVar4 + 1) {
    (*(code *)COST_SENSITIVE::cs_label)(*(long *)(in_RDI + 0x168) + (ulong)uVar4 * 0x20);
    v_array<COST_SENSITIVE::wclass>::push_back
              ((v_array<COST_SENSITIVE::wclass> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (wclass *)in_stack_ffffffffffffffb8);
  }
  plVar3 = calloc_or_throw<CB::label>(in_stack_00000188);
  *(label **)(in_RDI + 0x170) = plVar3;
  *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(in_RDI + 0x78);
  *(undefined4 *)(in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x134) = 0;
  *(undefined4 *)(in_RDI + 0x138) = 0;
  setup_lambdas(in_stack_ffffffffffffffe0);
  for (uVar4 = 0; uVar4 < *(uint *)(in_RDI + 0x80); uVar4 = uVar4 + 1) {
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)(ulong)in_stack_ffffffffffffffc0,
               (value_type_conflict3 *)in_stack_ffffffffffffffb8);
  }
  *(undefined4 *)(in_RDI + 0x130) = 0;
  return;
}

Assistant:

void init_adf_data(warm_cb& data, const size_t num_actions)
{
  data.num_actions = num_actions;
  if (data.sim_bandit)
    data.ws_type = BANDIT_WS;
  else
    data.ws_type = SUPERVISED_WS;
  data.ecs.resize(num_actions);
  for (size_t a=0; a < num_actions; ++a)
  {
    data.ecs[a] = VW::alloc_examples(CB::cb_label.label_size, 1);
    auto& lab = data.ecs[a]->l.cb;
    CB::cb_label.default_label(&lab);
  }

	// The rest of the initialization is for warm start CB
	data.csls = calloc_or_throw<COST_SENSITIVE::label>(num_actions);
	for (uint32_t a=0; a < num_actions; ++a)
	{
		COST_SENSITIVE::cs_label.default_label(&data.csls[a]);
		data.csls[a].costs.push_back({0, a+1, 0, 0});
	}
	data.cbls = calloc_or_throw<CB::label>(num_actions);

	data.ws_train_size = data.ws_period;
	data.ws_vali_size = 0;

	data.ws_iter = 0;
	data.inter_iter = 0;

	setup_lambdas(data);
	for (uint32_t i = 0; i < data.choices_lambda; i++)
		data.cumulative_costs.push_back(0.f);
	data.cumu_var = 0.f;
}